

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_settings_single_thread::set_str
          (session_settings_single_thread *this,int name,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  ::std::__cxx11::string::string((string *)&bStack_38,(string *)value);
  set<std::__cxx11::string,std::array<std::__cxx11::string,13ul>>
            (this,&this->m_strings,name,&bStack_38,0);
  ::std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void set_str(int name, std::string value)
		{ set<std::string>(m_strings, name, std::move(value), settings_pack::string_type_base); }